

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O1

string * __thiscall
cmOutputConverter::EscapeWindowsShellArgument_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,char *arg,int shell_flags)

{
  uint uVar1;
  char *out;
  size_t sVar2;
  char local_buffer [1024];
  char acStack_428 [1024];
  
  out = acStack_428;
  uVar1 = Shell__GetArgumentSize((char *)this,0,(int)arg);
  if (0x400 < (int)uVar1) {
    out = (char *)operator_new__((ulong)uVar1);
  }
  Shell__GetArgument((char *)this,out,0,(int)arg);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen(out);
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,out,out + sVar2);
  if (out != acStack_428) {
    operator_delete__(out);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmOutputConverter::EscapeWindowsShellArgument(const char* arg, int shell_flags)
{
  char local_buffer[1024];
  char* buffer = local_buffer;
  int size = Shell_GetArgumentSizeForWindows(arg, shell_flags);
  if(size > 1024)
    {
    buffer = new char[size];
    }
  Shell_GetArgumentForWindows(arg, buffer, shell_flags);
  std::string result(buffer);
  if(buffer != local_buffer)
    {
    delete [] buffer;
    }
  return result;
}